

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_length
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  int *piVar1;
  Alloc *pAVar2;
  Int IVar3;
  int iVar4;
  TagBase *this;
  string *psVar5;
  int i;
  Read<double> local_90;
  LOs local_80;
  LOs local_70;
  LOs local_60;
  LOs local_50;
  Reals prod_data;
  
  IVar3 = Mesh::ntags(old_mesh,1);
  if (0 < IVar3) {
    i = 0;
    do {
      this = Mesh::get_tag(old_mesh,1,i);
      psVar5 = TagBase::name_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        iVar4 = (*this->_vptr_TagBase[2])(this);
        if (iVar4 == 5) {
          IVar3 = TagBase::ncomps(this);
          if (IVar3 == 1) {
            local_50.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
            if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
                local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_50.write_.shared_alloc_.alloc =
                     (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_50.write_.shared_alloc_.alloc)->use_count =
                     (local_50.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_50.write_.shared_alloc_.direct_ptr =
                 (prods2new_ents->write_).shared_alloc_.direct_ptr;
            measure_edges_metric((Omega_h *)&prod_data,new_mesh,&local_50);
            pAVar2 = local_50.write_.shared_alloc_.alloc;
            if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
                local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            local_60.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
            if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
                local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_60.write_.shared_alloc_.alloc =
                     (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_60.write_.shared_alloc_.alloc)->use_count =
                     (local_60.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_60.write_.shared_alloc_.direct_ptr =
                 (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
            local_70.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
            if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
                local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_70.write_.shared_alloc_.alloc =
                     (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_70.write_.shared_alloc_.alloc)->use_count =
                     (local_70.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_70.write_.shared_alloc_.direct_ptr =
                 (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
            local_80.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
            if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
                local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_80.write_.shared_alloc_.alloc =
                     (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_80.write_.shared_alloc_.alloc)->use_count =
                     (local_80.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_80.write_.shared_alloc_.direct_ptr =
                 (prods2new_ents->write_).shared_alloc_.direct_ptr;
            local_90.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
            if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
                prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_90.write_.shared_alloc_.alloc =
                     (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (prod_data.write_.shared_alloc_.alloc)->use_count =
                     (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_90.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
            transfer_common<double>
                      (old_mesh,new_mesh,1,&local_60,&local_70,&local_80,this,&local_90);
            pAVar2 = local_90.write_.shared_alloc_.alloc;
            if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
                local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            pAVar2 = local_80.write_.shared_alloc_.alloc;
            if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
                local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            pAVar2 = local_70.write_.shared_alloc_.alloc;
            if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
                local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            pAVar2 = local_60.write_.shared_alloc_.alloc;
            if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
                local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            pAVar2 = prod_data.write_.shared_alloc_.alloc;
            if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
                prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
          }
        }
      }
      i = i + 1;
      IVar3 = Mesh::ntags(old_mesh,1);
    } while (i < IVar3);
  }
  return;
}

Assistant:

void transfer_length(Mesh* old_mesh, Mesh* new_mesh, LOs same_ents2old_ents,
    LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(EDGE); ++i) {
    auto tagbase = old_mesh->get_tag(EDGE, i);
    if (tagbase->name() == "length" && tagbase->type() == OMEGA_H_REAL &&
        tagbase->ncomps() == 1) {
      auto prod_data = measure_edges_metric(new_mesh, prods2new_ents);
      transfer_common(old_mesh, new_mesh, EDGE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}